

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_TransparentHashIntOverload,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>
::resize(raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_TransparentHashIntOverload,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>
         *this,size_t new_capacity)

{
  size_t hashval;
  ctrl_t *p;
  slot_type *psVar1;
  size_t capacity;
  undefined1 auVar2 [16];
  LayoutImpl<std::tuple<signed_char,phmap::priv::(anonymous_namespace)::DecomposeType>,phmap::integer_sequence<unsigned_long,0ul,1ul>,phmap::integer_sequence<unsigned_long,0ul,1ul>>
  *this_00;
  CopyConst<char,_ElementType<1UL>_>_conflict1 *pCVar3;
  size_t i;
  size_t sVar4;
  char *p_00;
  FindInfo FVar5;
  Layout LVar6;
  LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::(anonymous_namespace)::DecomposeType> local_40
  ;
  
  if ((new_capacity == 0) || ((new_capacity + 1 & new_capacity) != 0)) {
    __assert_fail("IsValidCapacity(new_capacity)",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x807,
                  "void phmap::priv::raw_hash_set<phmap::priv::(anonymous namespace)::DecomposePolicy, TransparentHashIntOverload, phmap::priv::(anonymous namespace)::DecomposeEq, std::allocator<int>>::resize(size_t) [Policy = phmap::priv::(anonymous namespace)::DecomposePolicy, Hash = TransparentHashIntOverload, Eq = phmap::priv::(anonymous namespace)::DecomposeEq, Alloc = std::allocator<int>]"
                 );
  }
  p = this->ctrl_;
  psVar1 = this->slots_;
  capacity = this->capacity_;
  local_40.size_ = (size_t  [2])MakeLayout(new_capacity);
  p_00 = (char *)((local_40.size_[0] + 3 & 0xfffffffffffffffc) + local_40.size_[1] * 4);
  this_00 = (LayoutImpl<std::tuple<signed_char,phmap::priv::(anonymous_namespace)::DecomposeType>,phmap::integer_sequence<unsigned_long,0ul,1ul>,phmap::integer_sequence<unsigned_long,0ul,1ul>>
             *)Allocate<4ul,std::allocator<int>>((allocator<int> *)&this->settings_,(size_t)p_00);
  internal_layout::
  LayoutImpl<std::tuple<signed_char,phmap::priv::(anonymous_namespace)::DecomposeType>,phmap::integer_sequence<unsigned_long,0ul,1ul>,phmap::integer_sequence<unsigned_long,0ul,1ul>>
  ::Pointer<0ul,char>(this_00,p_00);
  this->ctrl_ = (ctrl_t *)this_00;
  pCVar3 = internal_layout::
           LayoutImpl<std::tuple<signed_char,phmap::priv::(anonymous_namespace)::DecomposeType>,phmap::integer_sequence<unsigned_long,0ul,1ul>,phmap::integer_sequence<unsigned_long,0ul,1ul>>
           ::Pointer<1ul,char>((LayoutImpl<std::tuple<signed_char,phmap::priv::(anonymous_namespace)::DecomposeType>,phmap::integer_sequence<unsigned_long,0ul,1ul>,phmap::integer_sequence<unsigned_long,0ul,1ul>>
                                *)&local_40,(char *)this_00);
  this->slots_ = pCVar3;
  memset(this->ctrl_,0x80,new_capacity + 0x10);
  this->ctrl_[new_capacity] = -1;
  reset_growth_left(this,new_capacity);
  this->capacity_ = new_capacity;
  for (sVar4 = 0; capacity != sVar4; sVar4 = sVar4 + 1) {
    if (-1 < p[sVar4]) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (long)psVar1[sVar4].i;
      hashval = SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),8) +
                SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),0);
      FVar5 = find_first_non_full(this,hashval);
      set_ctrl(this,FVar5.offset,(byte)hashval & 0x7f);
      this->slots_[FVar5.offset].i = psVar1[sVar4].i;
    }
  }
  if (capacity != 0) {
    LVar6 = MakeLayout(capacity);
    Deallocate<4ul,std::allocator<int>>
              ((allocator<int> *)&this->settings_,p,
               (LVar6.
                super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::(anonymous_namespace)::DecomposeType>
                .size_[0] + 3 & 0xfffffffffffffffc) +
               LVar6.
               super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::(anonymous_namespace)::DecomposeType>
               .size_[1] * 4);
    return;
  }
  return;
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }